

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_flush(int flush_opts)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  ChannelBody *chB;
  SnapshotView local_60 [2];
  undefined1 local_40 [8];
  Channel channel;
  Caliper c;
  int flush_opts_local;
  
  this = &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  cali::Caliper::Caliper((Caliper *)this);
  cali::Caliper::get_channel((Caliper *)local_40,(cali_id_t)this);
  bVar1 = cali::Channel::operator_cast_to_bool((Channel *)local_40);
  if (bVar1) {
    chB = cali::Channel::body((Channel *)local_40);
    cali::SnapshotView::SnapshotView(local_60);
    cali::Caliper::flush_and_write
              ((Caliper *)
               &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,chB,local_60[0]);
    if ((flush_opts & 1U) != 0) {
      cali::Caliper::clear
                ((Caliper *)
                 &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(Channel *)local_40);
    }
  }
  cali::Channel::~Channel((Channel *)local_40);
  cali::Caliper::~Caliper
            ((Caliper *)
             &channel.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void cali_flush(int flush_opts)
{
    Caliper c;
    Channel channel = c.get_channel(0); // channel 0 should be the default channel

    if (channel) {
        c.flush_and_write(channel.body(), SnapshotView());

        if (flush_opts & CALI_FLUSH_CLEAR_BUFFERS)
            c.clear(&channel);
    }
}